

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCCluster::energy(VCCluster *this)

{
  long *in_RDI;
  ReturnType RVar1;
  ReturnType RVar2;
  Vector3d zi;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffffd0;
  double dVar3;
  undefined1 local_20 [32];
  
  (**(code **)(*in_RDI + 0x38))(local_20);
  if (((double)in_RDI[0xb] != 0.0) || (NAN((double)in_RDI[0xb]))) {
    other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI[0xb];
    RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_ffffffffffffffd0,other);
    RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_ffffffffffffffd0,other);
    dVar3 = (double)other * RVar1 + -(RVar2 * 2.0);
  }
  else {
    dVar3 = 0.0;
  }
  return dVar3;
}

Assistant:

double VCCluster::energy() {
	Vector3d zi = center();
	return area == 0 ? ENG_NULL : area * zi.dot(zi) - 2 * zi.dot(weightedSum);
}